

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void ChooseDistanceParams(BrotliEncoderParams *params)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  
  if (3 < params->quality) {
    if (params->mode == BROTLI_MODE_FONT) {
      uVar9 = 1;
      uVar4 = 0xc;
    }
    else {
      uVar9 = (params->dist).distance_postfix_bits;
      uVar4 = (params->dist).num_direct_distance_codes;
    }
    if ((uVar4 < 0x79 && uVar9 < 4) &&
       (bVar1 = (byte)uVar9, (uVar4 >> (bVar1 & 0x1f) & 0xf) << (bVar1 & 0x1f) == uVar4)) {
      uVar7 = 0xffffffff;
      (params->dist).distance_postfix_bits = uVar9;
      (params->dist).num_direct_distance_codes = uVar4;
      if (params->large_window == 0) {
        uVar9 = uVar4 + (0x18 << (bVar1 + 1 & 0x1f)) + 0x10;
        uVar6 = (ulong)uVar9;
        sVar11 = (size_t)((1 << (bVar1 + 0x1a & 0x1f)) + uVar4 + (-1 << (bVar1 + 2 & 0x1f)));
      }
      else {
        iVar8 = uVar4 + 0x10;
        if (uVar4 < 0x7ffffffc) {
          uVar10 = -1 << (bVar1 & 0x1f);
          iVar3 = -5;
          uVar5 = (0x7ffffffc - uVar4 >> (bVar1 & 0x1f)) + 4;
          for (uVar9 = uVar5; 1 < uVar9; uVar9 = uVar9 >> 1) {
            iVar3 = iVar3 + 2;
            uVar7 = uVar7 + 1;
          }
          uVar9 = (uint)((uVar5 >> (uVar7 & 0x1f) & 1) != 0) + iVar3;
          iVar3 = iVar8;
          if (uVar9 != 0xffffffff) {
            bVar2 = (byte)(uVar9 >> 1);
            iVar3 = uVar4 + (uVar9 << (bVar1 & 0x1f) | ~uVar10);
            uVar4 = (uVar4 - uVar10) +
                    ((6 << (bVar2 & 0x1f)) + ((uVar9 & 1) << (bVar2 + 1 & 0x1f)) + -5 <<
                    (bVar1 & 0x1f));
            iVar3 = iVar3 + 0x11;
          }
          uVar6 = CONCAT44(uVar4,iVar3);
        }
        else {
          uVar6 = 0x7ffffffc8000000c;
        }
        sVar11 = uVar6 >> 0x20;
        uVar9 = iVar8 + (0x3e << (bVar1 + 1 & 0x1f));
      }
      (params->dist).alphabet_size_max = uVar9;
      (params->dist).alphabet_size_limit = (uint32_t)uVar6;
      (params->dist).max_distance = sVar11;
      return;
    }
  }
  BrotliInitDistanceParams(params,0,0);
  return;
}

Assistant:

static void ChooseDistanceParams(BrotliEncoderParams* params) {
  uint32_t distance_postfix_bits = 0;
  uint32_t num_direct_distance_codes = 0;

  if (params->quality >= MIN_QUALITY_FOR_NONZERO_DISTANCE_PARAMS) {
    uint32_t ndirect_msb;
    if (params->mode == BROTLI_MODE_FONT) {
      distance_postfix_bits = 1;
      num_direct_distance_codes = 12;
    } else {
      distance_postfix_bits = params->dist.distance_postfix_bits;
      num_direct_distance_codes = params->dist.num_direct_distance_codes;
    }
    ndirect_msb = (num_direct_distance_codes >> distance_postfix_bits) & 0x0F;
    if (distance_postfix_bits > BROTLI_MAX_NPOSTFIX ||
        num_direct_distance_codes > BROTLI_MAX_NDIRECT ||
        (ndirect_msb << distance_postfix_bits) != num_direct_distance_codes) {
      distance_postfix_bits = 0;
      num_direct_distance_codes = 0;
    }
  }

  BrotliInitDistanceParams(
      params, distance_postfix_bits, num_direct_distance_codes);
}